

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_handling.hpp
# Opt level: O2

eAssertResult oqpi::assert_function(char *file,int line,char *expression,char *description,...)

{
  long lVar1;
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator<char> local_259;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string strMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  va_list argPtr;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  argPtr[0].reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  strMessage._M_dataplus._M_p = (pointer)&strMessage.field_2;
  strMessage._M_string_length = 0;
  strMessage.field_2._M_local_buf[0] = '\0';
  argPtr[0].overflow_arg_area = &stack0x00000008;
  argPtr[0].gp_offset = 0x20;
  argPtr[0].fp_offset = 0x30;
  lVar1 = *in_FS_OFFSET;
  local_b8 = in_R8;
  local_b0 = in_R9;
  vsnprintf((char *)(lVar1 + -0x400),0x400,description,argPtr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,expression,&local_259);
  std::operator+(&local_218,
                 "*************************************************************************\nAssertion failed:\n=================\n["
                 ,&local_238);
  std::operator+(&local_1f8,&local_218,
                 "]\n-------------------------------------------------------------------------\n");
  std::operator+(&local_1d8,&local_1f8,(char *)(lVar1 + -0x400));
  std::operator+(&local_1b8,&local_1d8,
                 "\n-------------------------------------------------------------------------\n");
  std::operator+(&local_198,&local_1b8,file);
  std::operator+(&local_178,&local_198,", line ");
  std::__cxx11::to_string(&local_258,line);
  std::operator+(&local_158,&local_178,&local_258);
  std::operator+(&local_118,&local_158,
                 "\n\n*************************************************************************\nStack trace:\n-------------------------------------------------------------------------\n"
                );
  std::__cxx11::string::operator=((string *)&strMessage,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::operator<<((ostream *)&std::cout,(string *)&strMessage);
  std::__cxx11::string::~string((string *)&strMessage);
  return eAR_Retry;
}

Assistant:

inline eAssertResult assert_function(const char *file, int line, const char *expression, const char *description = "", ...)
    {
        std::string strMessage;

        va_list argPtr;
        static const unsigned int bufferSize = 1 << 10;
        thread_local static char formattedMessage[bufferSize];
        va_start(argPtr, description);
        vsnprintf(formattedMessage, bufferSize, description, argPtr);
        va_end(argPtr);


        strMessage = std::string(
            "*************************************************************************\n"
            "Assertion failed:\n"
            "=================\n"
            "[" + std::string(expression) + "]\n"
            "-------------------------------------------------------------------------\n"
            + formattedMessage + "\n"
            "-------------------------------------------------------------------------\n"
            + file + ", line " + std::to_string(line) + "\n\n"
            "*************************************************************************\n"
            "Stack trace:\n"
            "-------------------------------------------------------------------------\n");

#if OQPI_PLATFORM_WIN
        eAssertResult assertResult = eAR_Ignore;
        int result = MessageBoxA(0, strMessage.c_str(), "Assertion Failed", MB_ABORTRETRYIGNORE);
        switch (result)
        {
        case IDABORT:
            assertResult = eAR_Abort;
            exit(1);
            break;

        case IDRETRY:
            assertResult = eAR_Retry;
            break;

        case IDIGNORE:
            assertResult = (GetAsyncKeyState(VK_SHIFT) & 0x8000) ? eAR_AlwaysIgnore : eAR_Ignore;
            break;
        }

        return assertResult;

#else
        std::cout << strMessage;
        return eAR_Retry;
#endif // OQPI_PLATFORM_WIN
    }